

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O1

Gia_Man_t *
Gia_ManAigSyn2(Gia_Man_t *pInit,int fOldAlgo,int fCoarsen,int fCutMin,int nRelaxRatio,int fDelayMin,
              int fVerbose,int fVeryVerbose)

{
  int *__ptr;
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p;
  Gia_Man_t *pGVar5;
  Gia_Man_t *p_00;
  Jf_Par_t local_128;
  
  if (fOldAlgo == 0) {
    Lf_ManSetDefaultPars(&local_128);
    local_128.fCutMin = fCutMin;
    local_128.fCoarsen = fCoarsen;
    local_128.nAreaTuner = 1;
    local_128.nCutNum = 4;
    local_128.nRelaxRatio = nRelaxRatio;
  }
  else {
    Jf_ManSetDefaultPars(&local_128);
    local_128.fCutMin = fCutMin;
  }
  if (fVerbose != 0) {
    Gia_ManPrintStats(pInit,(Gps_Par_t *)0x0);
  }
  p = Gia_ManDup(pInit);
  Gia_ManTransferTiming(p,pInit);
  uVar2 = local_128._84_8_;
  iVar1 = local_128.nRelaxRatio;
  if (p->nObjs != p->vCis->nSize + p->vCos->nSize + 1) {
    if ((fDelayMin != 0) && (p->pManTime == (void *)0x0)) {
      local_128.fCoarsen = 0;
      local_128.fCutMin = 0;
      local_128.nRelaxRatio = 0;
      if (fOldAlgo == 0) {
        Lf_ManPerformMapping(p,&local_128);
      }
      else {
        Jf_ManPerformMapping(p,&local_128);
      }
      iVar4 = (int)local_128.Area;
      iVar3 = (int)local_128.Delay;
      pGVar5 = Gia_ManPerformDsdBalance(p,6,4,0,0);
      if (fOldAlgo == 0) {
        Lf_ManPerformMapping(pGVar5,&local_128);
      }
      else {
        Jf_ManPerformMapping(pGVar5,&local_128);
      }
      if (((int)local_128.Delay < iVar3 + -1) ||
         ((iVar3 + 1 == (int)local_128.Delay &&
          (((double)((int)local_128.Area - iVar4) * 100.0) / (double)(int)local_128.Area < 3.0)))) {
        Gia_ManStop(p);
        p = pGVar5;
      }
      else {
        Gia_ManStop(pGVar5);
        if (p->vMapping != (Vec_Int_t *)0x0) {
          __ptr = p->vMapping->pArray;
          if (__ptr != (int *)0x0) {
            free(__ptr);
            p->vMapping->pArray = (int *)0x0;
          }
          if (p->vMapping != (Vec_Int_t *)0x0) {
            free(p->vMapping);
            p->vMapping = (Vec_Int_t *)0x0;
          }
        }
      }
    }
    local_128.nRelaxRatio = iVar1;
    local_128._84_8_ = uVar2;
    pGVar5 = Gia_ManAreaBalance(p,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar5,(Gps_Par_t *)0x0);
    }
    Gia_ManStop(p);
    if (fOldAlgo == 0) {
      p_00 = Lf_ManPerformMapping(pGVar5,&local_128);
    }
    else {
      p_00 = Jf_ManPerformMapping(pGVar5,&local_128);
    }
    if (fVerbose != 0) {
      Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
    }
    if (pGVar5 != p_00) {
      Gia_ManStop(pGVar5);
    }
    p = Gia_ManAreaBalance(p_00,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
    }
    Gia_ManStop(p_00);
  }
  return p;
}

Assistant:

Gia_Man_t * Gia_ManAigSyn2( Gia_Man_t * pInit, int fOldAlgo, int fCoarsen, int fCutMin, int nRelaxRatio, int fDelayMin, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * p, * pNew, * pTemp;
    Jf_Par_t Pars, * pPars = &Pars;
    if ( fOldAlgo )
    {
        Jf_ManSetDefaultPars( pPars );
        pPars->fCutMin     = fCutMin;
    }
    else
    {
        Lf_ManSetDefaultPars( pPars );
        pPars->fCutMin     = fCutMin;
        pPars->fCoarsen    = fCoarsen;
        pPars->nRelaxRatio = nRelaxRatio;
        pPars->nAreaTuner  = 1;
        pPars->nCutNum     = 4;
    }
    if ( fVerbose )  Gia_ManPrintStats( pInit, NULL );
    p = Gia_ManDup( pInit );
    Gia_ManTransferTiming( p, pInit );
    if ( Gia_ManAndNum(p) == 0 )
        return p;
    // delay optimization
    if ( fDelayMin && p->pManTime == NULL )
    {
        int Area0, Area1, Delay0, Delay1;
        int fCutMin = pPars->fCutMin;
        int fCoarsen = pPars->fCoarsen;
        int nRelaxRatio = pPars->nRelaxRatio;
        pPars->fCutMin = 0;
        pPars->fCoarsen = 0;
        pPars->nRelaxRatio = 0;
        // perform mapping
        if ( fOldAlgo )
            Jf_ManPerformMapping( p, pPars );
        else
            Lf_ManPerformMapping( p, pPars );
        Area0  = (int)pPars->Area;
        Delay0 = (int)pPars->Delay;
        // perform balancing
        pNew = Gia_ManPerformDsdBalance( p, 6, 4, 0, 0 );
        // perform mapping again
        if ( fOldAlgo )
            Jf_ManPerformMapping( pNew, pPars );
        else
            Lf_ManPerformMapping( pNew, pPars );
        Area1  = (int)pPars->Area;
        Delay1 = (int)pPars->Delay;
        // choose the best result
        if ( Delay1 < Delay0 - 1 || (Delay1 == Delay0 + 1 && 100.0 * (Area1 - Area0) / Area1 < 3.0) )
        {
            Gia_ManStop( p );
            p = pNew;
        }
        else
        {
            Gia_ManStop( pNew );
            Vec_IntFreeP( &p->vMapping );
        }
        // reset params
        pPars->fCutMin = fCutMin;
        pPars->fCoarsen = fCoarsen;
        pPars->nRelaxRatio = nRelaxRatio;
    }
    // perform balancing
    pNew = Gia_ManAreaBalance( p, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( p );
    // perform mapping
    if ( fOldAlgo )
        pNew = Jf_ManPerformMapping( pTemp = pNew, pPars );
    else
        pNew = Lf_ManPerformMapping( pTemp = pNew, pPars );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    if ( pTemp != pNew )
        Gia_ManStop( pTemp );
    // perform balancing
    pNew = Gia_ManAreaBalance( pTemp = pNew, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
    return pNew;
}